

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void Json::CharReaderBuilder::setDefaults(Value *settings)

{
  ushort uVar1;
  ValueHolder VVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  CommentInfo *pCVar6;
  ptrdiff_t pVar7;
  ptrdiff_t pVar8;
  ValueHolder *pVVar9;
  Value *pVVar10;
  ushort uVar11;
  ushort uVar12;
  ValueHolder local_1a0;
  ushort local_198;
  ValueHolder local_190;
  ValueHolder VStack_188;
  ValueHolder local_180;
  ValueHolder local_178;
  ushort local_170;
  ValueHolder local_168;
  ValueHolder VStack_160;
  ValueHolder local_158;
  ValueHolder local_150;
  ushort local_148;
  ValueHolder local_140;
  ValueHolder VStack_138;
  ValueHolder local_130;
  ValueHolder local_128;
  ushort local_120;
  CommentInfo *local_118;
  ptrdiff_t pStack_110;
  ptrdiff_t local_108;
  ValueHolder local_100;
  ushort local_f8;
  ValueHolder local_f0;
  ValueHolder VStack_e8;
  ValueHolder local_e0;
  ValueHolder local_d8;
  ushort local_d0;
  ValueHolder local_c8;
  ValueHolder VStack_c0;
  ValueHolder local_b8;
  ValueHolder local_b0;
  ushort local_a8;
  ValueHolder local_a0;
  ValueHolder VStack_98;
  ValueHolder local_90;
  ValueHolder local_88;
  ushort local_80;
  ValueHolder local_78;
  ValueHolder VStack_70;
  ValueHolder local_68;
  ValueHolder local_60;
  ushort local_58;
  ValueHolder local_50;
  ValueHolder VStack_48;
  ValueHolder local_40;
  ValueHolder local_38;
  ushort local_30;
  ValueHolder local_28;
  ValueHolder VStack_20;
  ValueHolder local_18;
  
  uVar11 = local_30 & 0xfe00;
  local_30 = uVar11 + 5;
  local_28 = (ValueHolder)0x0;
  VStack_20 = (ValueHolder)0x0;
  local_18 = (ValueHolder)0x0;
  local_38.bool_ = true;
  pVVar9 = &Value::resolveReference(settings,"collectComments","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2 = *pVVar9;
  *pVVar9 = local_38;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_30 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_28;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_20;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_18;
  local_38 = VVar2;
  local_28 = VVar3;
  VStack_20 = VVar4;
  local_18 = VVar5;
  Value::~Value((Value *)&local_38);
  uVar11 = local_58 & 0xfe00;
  local_58 = uVar11 + 5;
  local_50 = (ValueHolder)0x0;
  VStack_48 = (ValueHolder)0x0;
  local_40 = (ValueHolder)0x0;
  local_60.bool_ = true;
  pVVar9 = &Value::resolveReference(settings,"allowComments","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2 = *pVVar9;
  *pVVar9 = local_60;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_58 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_50;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_48;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_40;
  local_60 = VVar2;
  local_50 = VVar3;
  VStack_48 = VVar4;
  local_40 = VVar5;
  Value::~Value((Value *)&local_60);
  uVar11 = local_80 & 0xfe00;
  local_80 = uVar11 + 5;
  local_78 = (ValueHolder)0x0;
  VStack_70 = (ValueHolder)0x0;
  local_68 = (ValueHolder)0x0;
  local_88.uint_ = local_88.uint_ & 0xffffffffffffff00;
  pVVar9 = &Value::resolveReference(settings,"strictRoot","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2.uint_ = *(LargestUInt *)pVVar9;
  pVVar9->uint_ = (LargestUInt)local_88;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_80 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_78;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_70;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_68;
  local_88.uint_ = VVar2.uint_;
  local_78 = VVar3;
  VStack_70 = VVar4;
  local_68 = VVar5;
  Value::~Value((Value *)&local_88);
  uVar11 = local_a8 & 0xfe00;
  local_a8 = uVar11 + 5;
  local_a0 = (ValueHolder)0x0;
  VStack_98 = (ValueHolder)0x0;
  local_90 = (ValueHolder)0x0;
  local_b0.uint_ = local_b0.uint_ & 0xffffffffffffff00;
  pVVar9 = &Value::resolveReference(settings,"allowDroppedNullPlaceholders","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2.uint_ = *(LargestUInt *)pVVar9;
  pVVar9->uint_ = (LargestUInt)local_b0;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_a8 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_a0;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_98;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_90;
  local_b0.uint_ = VVar2.uint_;
  local_a0 = VVar3;
  VStack_98 = VVar4;
  local_90 = VVar5;
  Value::~Value((Value *)&local_b0);
  uVar11 = local_d0 & 0xfe00;
  local_d0 = uVar11 + 5;
  local_c8 = (ValueHolder)0x0;
  VStack_c0 = (ValueHolder)0x0;
  local_b8 = (ValueHolder)0x0;
  local_d8.uint_ = local_d8.uint_ & 0xffffffffffffff00;
  pVVar9 = &Value::resolveReference(settings,"allowNumericKeys","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2.uint_ = *(LargestUInt *)pVVar9;
  pVVar9->uint_ = (LargestUInt)local_d8;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_d0 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_c8;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_c0;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_b8;
  local_d8.uint_ = VVar2.uint_;
  local_c8 = VVar3;
  VStack_c0 = VVar4;
  local_b8 = VVar5;
  Value::~Value((Value *)&local_d8);
  uVar11 = local_f8 & 0xfe00;
  local_f8 = uVar11 + 5;
  local_f0 = (ValueHolder)0x0;
  VStack_e8 = (ValueHolder)0x0;
  local_e0 = (ValueHolder)0x0;
  local_100.uint_ = local_100.uint_ & 0xffffffffffffff00;
  pVVar9 = &Value::resolveReference(settings,"allowSingleQuotes","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2.uint_ = *(LargestUInt *)pVVar9;
  pVVar9->uint_ = (LargestUInt)local_100;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_f8 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_f0;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_e8;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_e0;
  local_100.uint_ = VVar2.uint_;
  local_f0 = VVar3;
  VStack_e8 = VVar4;
  local_e0 = VVar5;
  Value::~Value((Value *)&local_100);
  uVar12 = local_120 & 0xfe00;
  local_120 = uVar12 + 1;
  local_118 = (CommentInfo *)0x0;
  pStack_110 = 0;
  local_108 = 0;
  local_128.int_ = 1000;
  pVVar10 = Value::resolveReference(settings,"stackLimit","");
  uVar1 = *(ushort *)&pVVar10->field_0x8;
  uVar11 = (uVar1 & 0xff00) + 1;
  *(ushort *)&pVVar10->field_0x8 = uVar11;
  local_128.int_ = *(LargestInt *)&pVVar10->value_;
  (pVVar10->value_).int_ = 1000;
  *(ushort *)&pVVar10->field_0x8 = uVar11 & 0xfe01;
  local_120 = uVar1 & 0x100 | uVar12 | uVar1 & 0xff;
  pCVar6 = pVVar10->comments_;
  pVVar10->comments_ = local_118;
  pVar7 = pVVar10->start_;
  pVVar10->start_ = pStack_110;
  pVar8 = pVVar10->limit_;
  pVVar10->limit_ = local_108;
  local_118 = pCVar6;
  pStack_110 = pVar7;
  local_108 = pVar8;
  Value::~Value((Value *)&local_128);
  uVar11 = local_148 & 0xfe00;
  local_148 = uVar11 + 5;
  local_140 = (ValueHolder)0x0;
  VStack_138 = (ValueHolder)0x0;
  local_130 = (ValueHolder)0x0;
  local_150.uint_ = local_150.uint_ & 0xffffffffffffff00;
  pVVar9 = &Value::resolveReference(settings,"failIfExtra","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2.uint_ = *(LargestUInt *)pVVar9;
  pVVar9->uint_ = (LargestUInt)local_150;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_148 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_140;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_138;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_130;
  local_150.uint_ = VVar2.uint_;
  local_140 = VVar3;
  VStack_138 = VVar4;
  local_130 = VVar5;
  Value::~Value((Value *)&local_150);
  uVar11 = local_170 & 0xfe00;
  local_170 = uVar11 + 5;
  local_168 = (ValueHolder)0x0;
  VStack_160 = (ValueHolder)0x0;
  local_158 = (ValueHolder)0x0;
  local_178.uint_ = local_178.uint_ & 0xffffffffffffff00;
  pVVar9 = &Value::resolveReference(settings,"rejectDupKeys","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2.uint_ = *(LargestUInt *)pVVar9;
  pVVar9->uint_ = (LargestUInt)local_178;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_170 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_168;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_160;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_158;
  local_178.uint_ = VVar2.uint_;
  local_168 = VVar3;
  VStack_160 = VVar4;
  local_158 = VVar5;
  Value::~Value((Value *)&local_178);
  uVar11 = local_198 & 0xfe00;
  local_198 = uVar11 + 5;
  local_190 = (ValueHolder)0x0;
  VStack_188 = (ValueHolder)0x0;
  local_180 = (ValueHolder)0x0;
  local_1a0.uint_ = local_1a0.uint_ & 0xffffffffffffff00;
  pVVar9 = &Value::resolveReference(settings,"allowSpecialFloats","")->value_;
  uVar1 = *(ushort *)(pVVar9 + 1);
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xff00 | 5;
  VVar2.uint_ = *(LargestUInt *)pVVar9;
  pVVar9->uint_ = (LargestUInt)local_1a0;
  *(ushort *)(pVVar9 + 1) = uVar1 & 0xfe00 | 5;
  local_198 = uVar1 & 0x100 | uVar11 | uVar1 & 0xff;
  VVar3 = pVVar9[2];
  pVVar9[2].int_ = (LargestInt)local_190;
  VVar4 = pVVar9[3];
  pVVar9[3].int_ = (LargestInt)VStack_188;
  VVar5 = pVVar9[4];
  pVVar9[4].int_ = (LargestInt)local_180;
  local_1a0.uint_ = VVar2.uint_;
  local_190 = VVar3;
  VStack_188 = VVar4;
  local_180 = VVar5;
  Value::~Value((Value *)&local_1a0);
  return;
}

Assistant:

void CharReaderBuilder::setDefaults(Json::Value* settings)
{
//! [CharReaderBuilderDefaults]
  (*settings)["collectComments"] = true;
  (*settings)["allowComments"] = true;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = false;
  (*settings)["rejectDupKeys"] = false;
  (*settings)["allowSpecialFloats"] = false;
//! [CharReaderBuilderDefaults]
}